

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O1

int __thiscall MyObserver::on_exit(MyObserver *this,__func *__func,void *__arg)

{
  int iVar1;
  ostream *poVar2;
  ostringstream oss;
  char local_1b0;
  undefined7 uStack_1af;
  long local_1a8;
  long local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"worker ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," finished running ",0x12);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)((long)__arg + 8),*(long *)((long)__arg + 0x10));
  local_1b0 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b0,1);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)CONCAT71(uStack_1af,local_1b0),local_1a8);
  if ((long *)CONCAT71(uStack_1af,local_1b0) != local_1a0) {
    operator_delete((long *)CONCAT71(uStack_1af,local_1b0),local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  iVar1 = std::ios_base::~ios_base(local_120);
  return iVar1;
}

Assistant:

void on_exit(tf::WorkerView wv, tf::TaskView tv) override final {
    std::ostringstream oss;
    oss << "worker " << wv.id() << " finished running " << tv.name() << '\n';
    std::cout << oss.str();
  }